

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe37At7(uint8_t *buf)

{
  return (ulong)(*buf >> 7) +
         ((ulong)buf[1] |
         (ulong)buf[2] << 8 | (ulong)buf[3] << 0x10 | ((ulong)*(ushort *)(buf + 4) & 0xfff) << 0x18)
         * 2;
}

Assistant:

std::uint64_t readFlUIntLe37At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 1;
    res |= (buf[0] >> 7);
    res &= UINT64_C(0x1fffffffff);
    return res;
}